

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264d_dpb.c
# Opt level: O1

MPP_RET write_unpaired_field(H264dVideoCtx_t *p_Vid,H264_FrameStore_t *fs)

{
  int iVar1;
  h264_store_pic_t *phVar2;
  MPP_RET MVar3;
  H264_StorePic_t *pHVar4;
  char *fmt;
  undefined8 uVar5;
  
  if (2 < fs->is_used) {
    MVar3 = MPP_ERR_VALUE;
    if (((byte)h264d_debug & 4) == 0) {
      return MPP_ERR_VALUE;
    }
    fmt = "value error(%d).\n";
    uVar5 = 0x3b6;
    goto LAB_00196f8d;
  }
  if ((fs->is_used & 1U) != 0) {
    phVar2 = fs->top_field;
    pHVar4 = alloc_storable_picture(p_Vid,2);
    fs->bottom_field = pHVar4;
    if (pHVar4 == (H264_StorePic_t *)0x0) {
      MVar3 = MPP_ERR_MALLOC;
      if (((byte)h264d_debug & 1) == 0) {
        return MPP_ERR_MALLOC;
      }
      fmt = "malloc buffer error(%d).\n";
      uVar5 = 0x3ba;
      goto LAB_00196f8d;
    }
    pHVar4->mem_malloc_type = Mem_UnPaired;
    pHVar4->chroma_format_idc = phVar2->chroma_format_idc;
    MVar3 = dpb_combine_field_yuv(p_Vid,fs,'\0');
    if (MVar3 < MPP_OK) {
      if (((byte)h264d_debug & 4) == 0) {
        return MVar3;
      }
      fmt = "Function error(%d).\n";
      uVar5 = 0x3bd;
      goto LAB_00196f8d;
    }
    phVar2 = fs->frame;
    phVar2->view_id = fs->view_id;
    phVar2->mem_malloc_type = Mem_TopOnly;
    if (((byte)h264d_debug & 4) != 0) {
      _mpp_log_l(4,"h264d_dpb","write frame, line %d",(char *)0x0,0x3c0);
    }
    write_picture(fs->frame,p_Vid);
  }
  if ((fs->is_used & 2) != 0) {
    phVar2 = fs->bottom_field;
    pHVar4 = alloc_storable_picture(p_Vid,1);
    fs->top_field = pHVar4;
    if (pHVar4 == (H264_StorePic_t *)0x0) {
      MVar3 = MPP_ERR_MALLOC;
      if (((byte)h264d_debug & 1) == 0) {
        return MPP_ERR_MALLOC;
      }
      fmt = "malloc buffer error(%d).\n";
      uVar5 = 0x3c7;
    }
    else {
      pHVar4->mem_malloc_type = Mem_UnPaired;
      pHVar4->chroma_format_idc = phVar2->chroma_format_idc;
      phVar2 = fs->bottom_field;
      iVar1 = phVar2->frame_cropping_flag;
      pHVar4->frame_cropping_flag = iVar1;
      if (iVar1 != 0) {
        pHVar4->frame_crop_top_offset = phVar2->frame_crop_top_offset;
        pHVar4->frame_crop_bottom_offset = phVar2->frame_crop_bottom_offset;
        pHVar4->frame_crop_left_offset = phVar2->frame_crop_left_offset;
        pHVar4->frame_crop_right_offset = phVar2->frame_crop_right_offset;
      }
      MVar3 = dpb_combine_field_yuv(p_Vid,fs,'\0');
      if (MPP_NOK < MVar3) {
        phVar2 = fs->frame;
        phVar2->view_id = fs->view_id;
        phVar2->mem_malloc_type = Mem_BotOnly;
        if (((byte)h264d_debug & 4) != 0) {
          _mpp_log_l(4,"h264d_dpb","write frame, line %d",(char *)0x0,0x3d4);
        }
        write_picture(fs->frame,p_Vid);
        goto LAB_00196f57;
      }
      if (((byte)h264d_debug & 4) == 0) {
        return MVar3;
      }
      fmt = "Function error(%d).\n";
      uVar5 = 0x3d1;
    }
LAB_00196f8d:
    _mpp_log_l(4,"h264d_dpb",fmt,(char *)0x0,uVar5);
    return MVar3;
  }
LAB_00196f57:
  fs->is_used = 3;
  return MPP_OK;
}

Assistant:

static MPP_RET write_unpaired_field(H264dVideoCtx_t *p_Vid, H264_FrameStore_t *fs)
{
    MPP_RET ret = MPP_ERR_UNKNOW;
    H264_StorePic_t *p = NULL;

    VAL_CHECK(ret, fs->is_used < 3);
    if (fs->is_used & 0x01) { // we have a top field, construct an empty bottom field
        p = fs->top_field;
        fs->bottom_field = alloc_storable_picture(p_Vid, BOTTOM_FIELD);
        MEM_CHECK(ret, fs->bottom_field);
        fs->bottom_field->mem_malloc_type = Mem_UnPaired;
        fs->bottom_field->chroma_format_idc = p->chroma_format_idc;
        FUN_CHECK(ret = dpb_combine_field_yuv(p_Vid, fs, 0));
        fs->frame->view_id = fs->view_id;
        fs->frame->mem_malloc_type = Mem_TopOnly;
        H264D_WARNNING("write frame, line %d", __LINE__);
        write_picture(fs->frame, p_Vid);
    }

    if (fs->is_used & 0x02) { // we have a bottom field, construct an empty top field
        p = fs->bottom_field;
        fs->top_field = alloc_storable_picture(p_Vid, TOP_FIELD);
        MEM_CHECK(ret, fs->top_field);
        fs->top_field->mem_malloc_type = Mem_UnPaired;
        fs->top_field->chroma_format_idc = p->chroma_format_idc;
        fs->top_field->frame_cropping_flag = fs->bottom_field->frame_cropping_flag;
        if (fs->top_field->frame_cropping_flag) {
            fs->top_field->frame_crop_top_offset = fs->bottom_field->frame_crop_top_offset;
            fs->top_field->frame_crop_bottom_offset = fs->bottom_field->frame_crop_bottom_offset;
            fs->top_field->frame_crop_left_offset = fs->bottom_field->frame_crop_left_offset;
            fs->top_field->frame_crop_right_offset = fs->bottom_field->frame_crop_right_offset;
        }
        FUN_CHECK(ret = dpb_combine_field_yuv(p_Vid, fs, 0));
        fs->frame->view_id = fs->view_id;
        fs->frame->mem_malloc_type = Mem_BotOnly;
        H264D_WARNNING("write frame, line %d", __LINE__);
        write_picture(fs->frame, p_Vid);
    }
    fs->is_used = 3;

    return ret = MPP_OK;
__FAILED:
    return ret;
}